

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleCacheMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  cmState *pcVar2;
  char *pcVar3;
  string local_40;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"not given name for CACHE scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    pcVar3 = cmState::GetCacheEntryValue(pcVar2,&this->Name);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar2 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      pcVar3 = cmState::GetCacheEntryProperty(pcVar2,&this->Name,&this->PropertyName);
    }
    StoreResult(this,pcVar3);
  }
  return sVar1 != 0;
}

Assistant:

bool cmGetPropertyCommand::HandleCacheMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for CACHE scope.");
    return false;
  }

  const char* value = nullptr;
  if (this->Makefile->GetState()->GetCacheEntryValue(this->Name)) {
    value = this->Makefile->GetState()->GetCacheEntryProperty(
      this->Name, this->PropertyName);
  }
  this->StoreResult(value);
  return true;
}